

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall test::get_ts(test *this)

{
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int n_tokens;
  vector<double,_std::allocator<double>_> *ts;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  
  __first._M_current = (unsigned_long *)in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1a8951);
  __last._M_current =
       (unsigned_long *)
       &in_RSI.container[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff88);
  std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff88);
  std::
  transform<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,test::get_ts()const::_lambda(unsigned_long)_1_>
            (__first,__last,in_RSI,(anon_class_4_1_f85df009)(int)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

std::vector<double> get_ts() const {
        int                 n_tokens = n_prompt + n_gen;
        std::vector<double> ts;
        std::transform(samples_ns.begin(), samples_ns.end(), std::back_inserter(ts),
                       [n_tokens](uint64_t t) { return 1e9 * n_tokens / t; });
        return ts;
    }